

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O2

StorageClass __thiscall spv::Module::getStorageClass(Module *this,Id typeId)

{
  Instruction *this_00;
  StorageClass SVar1;
  
  this_00 = (this->idToInstruction).
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start[typeId];
  if (this_00->opCode == OpTypePointer) {
    SVar1 = Instruction::getImmediateOperand(this_00,0);
    return SVar1;
  }
  __assert_fail("idToInstruction[typeId]->getOpCode() == spv::OpTypePointer",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                ,0x200,"StorageClass spv::Module::getStorageClass(Id) const");
}

Assistant:

StorageClass getStorageClass(Id typeId) const
    {
        assert(idToInstruction[typeId]->getOpCode() == spv::OpTypePointer);
        return (StorageClass)idToInstruction[typeId]->getImmediateOperand(0);
    }